

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O1

ui_event textui_get_command(int *count)

{
  int *piVar1;
  bool bVar2;
  _Bool _Var3;
  char *str;
  ushort **ppuVar4;
  keypress *__src;
  undefined8 extraout_RDX;
  size_t __n;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ui_event uVar9;
  keypress kVar10;
  keypress tmp [2];
  ui_event local_68;
  uint local_5c;
  undefined1 local_58 [16];
  undefined8 local_48;
  int *local_38;
  
  _Var3 = (player->opts).opt[1];
  uVar5 = (uint)_Var3;
  local_48 = 0;
  local_58._0_4_ = EVT_NONE;
  local_58._4_4_ = 0;
  local_58._8_8_ = 0;
  local_68.type = EVT_NONE;
  local_68.key.code = 0;
  local_68._8_4_ = 0;
  __src = (keypress *)0x0;
  local_5c = (uint)_Var3;
  local_38 = count;
  do {
    msg_flag = false;
    inkey_flag = true;
    if ((player->opts).opt[9] == true) {
      Term_set_cursor(true);
      move_cursor_relative((player->grid).y,(player->grid).x);
    }
    uVar9 = inkey_ex();
    local_68.type = uVar9.type;
    local_68.key.code = uVar9.key.code;
    local_68.key.mods = uVar9.key.mods;
    if ((player->opts).opt[9] == true) {
      Term_set_cursor(false);
    }
    if (local_68.type != EVT_KBRD) goto LAB_001d2edb;
    if (local_68.key.code == 0x5e) {
      _Var3 = get_com_ex("Control: ",&local_68);
      bVar2 = false;
      if ((_Var3) && (local_68.type == EVT_KBRD)) {
        if ((local_68.key.code & 0xffffffe0) == 0x40 || local_68.key.code - 0x61 < 0x1a) {
          local_68.key.code = local_68.key.code & 0x1f;
        }
        else {
          local_68._8_4_ = local_68._8_4_ | 1;
        }
        goto LAB_001d2ebf;
      }
    }
    else {
      if (local_68.key.code == 0x5c) {
        get_com_ex("Command: ",&local_68);
      }
      else {
        if ((local_68.key.code == 0x30) &&
           (((undefined1  [12])uVar9 & (undefined1  [12])0x10) == (undefined1  [12])0x0)) {
          iVar7 = 0;
          do {
            str = format("Repeat: %d");
            prt(str,L'\0',L'\0');
            kVar10 = inkey();
            uVar6 = kVar10._0_8_ >> 0x20;
            iVar8 = 1;
            if (uVar6 != 0xe000) {
              uVar5 = kVar10.code;
              if (uVar5 >> 1 == 0x4f) {
                iVar7 = iVar7 / 10;
                iVar8 = 0;
              }
              else {
                ppuVar4 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar4 + (uVar6 & 0xff) * 2 + 1) & 8) == 0) {
                  iVar8 = 3;
                  if (uVar5 != 0x9c) {
                    Term_keypress(uVar5,kVar10.mods);
                  }
                }
                else {
                  iVar7 = (uVar5 - 0x30) + iVar7 * 10;
                  iVar8 = 0;
                  if (0x270e < iVar7) {
                    bell();
                    iVar7 = 9999;
                  }
                }
              }
            }
          } while (iVar8 == 0);
          if (iVar8 != 3) {
            iVar7 = -1;
          }
          if (iVar7 != -1) {
            _Var3 = get_com_ex("Command: ",&local_68);
            if (_Var3) {
              *local_38 = iVar7;
              uVar5 = local_5c;
              goto LAB_001d2ebf;
            }
          }
          bVar2 = false;
          uVar5 = local_5c;
          goto LAB_001d2ed3;
        }
LAB_001d2ebf:
        kVar10.code = local_68.key.code;
        kVar10.type = local_68.type;
        kVar10._8_4_ = local_68._8_4_;
        __src = keymap_find(uVar5,kVar10);
      }
      bVar2 = true;
    }
LAB_001d2ed3:
    if (bVar2) {
LAB_001d2edb:
      prt("",L'\0',L'\0');
      if (local_68.type == EVT_BUTTON) {
        local_58._8_4_ = local_68._8_4_;
        local_58._0_4_ = EVT_BUTTON;
        local_58._4_4_ = local_68._4_4_;
        __src = (keypress *)local_58;
      }
      if (((local_68.key.code == 0) || (__src == (keypress *)0x0)) ||
         (inkey_next != (keypress *)0x0)) {
        uVar9.key.code = local_68.key.code;
        uVar9.type = local_68.type;
        uVar9._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_68.key.mods);
        return uVar9;
      }
      __n = 0;
      do {
        piVar1 = (int *)((long)&__src->type + __n);
        __n = __n + 0xc;
      } while (*piVar1 != 0);
      memcpy(request_command_buffer,__src,__n);
      inkey_next = request_command_buffer;
    }
  } while( true );
}

Assistant:

ui_event textui_get_command(int *count)
{
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	struct keypress tmp[2] = { KEYPRESS_NULL, KEYPRESS_NULL };

	ui_event ke = EVENT_EMPTY;

	const struct keypress *act = NULL;



	/* Get command */
	while (1) {
		/* Hack -- no flush needed */
		msg_flag = false;

		/* Activate "command mode" */
		inkey_flag = true;

		/* Toggle on cursor if requested */
		if (OPT(player, highlight_player)) {
			Term_set_cursor(true);
			move_cursor_relative(player->grid.y, player->grid.x);
		}

		/* Get a command */
		ke = inkey_ex();

		/* Toggle off cursor */
		if (OPT(player, highlight_player)) {
			Term_set_cursor(false);
		}

		if (ke.type == EVT_KBRD) {
			bool keymap_ok = true;
			switch (ke.key.code) {
				case '0': {
					if(ke.key.mods & KC_MOD_KEYPAD) break;

					int c = textui_get_count();

					if (c == -1 || !get_com_ex("Command: ", &ke))
						continue;
					else
						*count = c;
					break;
				}

				case '\\': {
					/* Allow keymaps to be bypassed */
					(void)get_com_ex("Command: ", &ke);
					keymap_ok = false;
					break;
				}

				case '^': {
					/* Allow "control chars" to be entered */
					if (!get_com_ex("Control: ", &ke)
							|| ke.type != EVT_KBRD) {
						continue;
					}
					if (ENCODE_KTRL(ke.key.code)) {
						ke.key.code = KTRL(ke.key.code);
					} else {
						ke.key.mods |= KC_MOD_CONTROL;
					}
					break;
				}
			}

			/* Find any relevant keymap */
			if (keymap_ok)
				act = keymap_find(mode, ke.key);
		}

		/* Erase the message line */
		prt("", 0, 0);

		if (ke.type == EVT_BUTTON) {
			/* Buttons are always specified in standard keyset */
			act = tmp;
			tmp[0] = ke.key;
		}

		/* Apply keymap if not inside a keymap already */
		if (ke.key.code && act && !inkey_next) {
			size_t n = 0;
			while (act[n].type)
				n++;

			/* Make room for the terminator */
			n += 1;

			/* Install the keymap */
			memcpy(request_command_buffer, act, n * sizeof(struct keypress));

			/* Start using the buffer */
			inkey_next = request_command_buffer;

			/* Continue */
			continue;
		}

		/* Done */
		break;
	}

	return ke;
}